

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

void tt_face_free_name(TT_Face face)

{
  FT_Memory memory_00;
  TT_NameRec *pTVar1;
  TT_LangTagRec *pTVar2;
  TT_LangTag limit_1;
  TT_LangTag entry_1;
  TT_Name limit;
  TT_Name entry;
  TT_NameTable table;
  FT_Memory memory;
  TT_Face face_local;
  
  memory_00 = (((face->root).driver)->root).memory;
  if ((face->name_table).names != (TT_NameRec *)0x0) {
    limit = (face->name_table).names;
    pTVar1 = limit + (face->name_table).numNameRecords;
    for (; limit < pTVar1; limit = limit + 1) {
      ft_mem_free(memory_00,limit->string);
      limit->string = (FT_Byte *)0x0;
    }
    ft_mem_free(memory_00,(face->name_table).names);
    (face->name_table).names = (TT_NameRec *)0x0;
  }
  if ((face->name_table).langTags != (TT_LangTagRec *)0x0) {
    limit_1 = (face->name_table).langTags;
    pTVar2 = limit_1 + (face->name_table).numLangTagRecords;
    for (; limit_1 < pTVar2; limit_1 = limit_1 + 1) {
      ft_mem_free(memory_00,limit_1->string);
      limit_1->string = (FT_Byte *)0x0;
    }
    ft_mem_free(memory_00,(face->name_table).langTags);
    (face->name_table).langTags = (TT_LangTagRec *)0x0;
  }
  (face->name_table).numNameRecords = 0;
  (face->name_table).numLangTagRecords = 0;
  (face->name_table).format = 0;
  (face->name_table).storageOffset = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_name( TT_Face  face )
  {
    FT_Memory     memory = face->root.driver->root.memory;
    TT_NameTable  table  = &face->name_table;


    if ( table->names )
    {
      TT_Name  entry = table->names;
      TT_Name  limit = entry + table->numNameRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->names );
    }

    if ( table->langTags )
    {
      TT_LangTag  entry = table->langTags;
      TT_LangTag  limit = entry + table->numLangTagRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->langTags );
    }

    table->numNameRecords    = 0;
    table->numLangTagRecords = 0;
    table->format            = 0;
    table->storageOffset     = 0;
  }